

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int stb_vorbis_decode_filename(char *filename,int *channels,int *sample_rate,short **output)

{
  int iVar1;
  stb_vorbis *f;
  short *__ptr;
  short *psVar2;
  short *psVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  int error;
  int local_34;
  
  f = stb_vorbis_open_filename(filename,&local_34,(stb_vorbis_alloc *)0x0);
  if (f == (stb_vorbis *)0x0) {
    iVar6 = -1;
  }
  else {
    iVar6 = f->channels;
    *channels = iVar6;
    uVar8 = (long)iVar6 << 0xc;
    if (sample_rate != (int *)0x0) {
      *sample_rate = f->sample_rate;
    }
    __ptr = (short *)malloc((long)iVar6 << 0xd);
    if (__ptr == (short *)0x0) {
      iVar6 = -2;
    }
    else {
      iVar7 = 0;
      uVar5 = uVar8 & 0xffffffff;
      iVar6 = 0;
      do {
        iVar4 = (int)uVar5;
        iVar1 = stb_vorbis_get_frame_short_interleaved(f,f->channels,__ptr + iVar7,iVar4 - iVar7);
        if (iVar1 == 0) {
          cVar9 = '\x02';
        }
        else {
          iVar6 = iVar6 + iVar1;
          iVar7 = f->channels * iVar1 + iVar7;
          cVar9 = '\0';
          if (iVar4 < (int)uVar8 + iVar7) {
            uVar5 = (ulong)(uint)(iVar4 * 2);
            psVar2 = (short *)realloc(__ptr,(long)(iVar4 * 2) * 2);
            psVar3 = psVar2;
            if (psVar2 == (short *)0x0) {
              free(__ptr);
              stb_vorbis_close(f);
              psVar3 = __ptr;
            }
            cVar9 = psVar2 == (short *)0x0;
            __ptr = psVar3;
          }
        }
      } while (cVar9 == '\0');
      if (cVar9 != '\x02') {
        return -2;
      }
      *output = __ptr;
    }
    stb_vorbis_close(f);
  }
  return iVar6;
}

Assistant:

int stb_vorbis_decode_filename(const char *filename, int *channels, int *sample_rate, short **output)
{
   int data_len, offset, total, limit, error;
   short *data;
   stb_vorbis *v = stb_vorbis_open_filename(filename, &error, NULL);
   if (v == NULL) return -1;
   limit = v->channels * 4096;
   *channels = v->channels;
   if (sample_rate)
      *sample_rate = v->sample_rate;
   offset = data_len = 0;
   total = limit;
   data = (short *) malloc(total * sizeof(*data));
   if (data == NULL) {
      stb_vorbis_close(v);
      return -2;
   }
   for (;;) {
      int n = stb_vorbis_get_frame_short_interleaved(v, v->channels, data+offset, total-offset);
      if (n == 0) break;
      data_len += n;
      offset += n * v->channels;
      if (offset + limit > total) {
         short *data2;
         total *= 2;
         data2 = (short *) realloc(data, total * sizeof(*data));
         if (data2 == NULL) {
            free(data);
            stb_vorbis_close(v);
            return -2;
         }
         data = data2;
      }
   }
   *output = data;
   stb_vorbis_close(v);
   return data_len;
}